

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logconf.c
# Opt level: O3

char * append_unsafe_string_json(char *pos,char *src,size_t len)

{
  size_t sVar1;
  char cVar2;
  
  if (len != 0) {
    sVar1 = 0;
    do {
      cVar2 = src[sVar1];
      if ((byte)(cVar2 - 0x20U) < 0x5e) {
        if ((cVar2 == '\\') || (cVar2 == '\"')) {
          *pos = '\\';
          pos = pos + 1;
          cVar2 = src[sVar1];
        }
        *pos = cVar2;
        pos = pos + 1;
      }
      else {
        pos[0] = '\\';
        pos[1] = 'u';
        pos[2] = '0';
        pos[3] = '0';
        pos[4] = "0123456789abcdef"[(byte)src[sVar1] >> 4];
        pos[5] = "0123456789abcdef"[(byte)src[sVar1] & 0xf];
        pos = pos + 6;
      }
      sVar1 = sVar1 + 1;
    } while (len != sVar1);
  }
  return pos;
}

Assistant:

static char *append_unsafe_string_json(char *pos, const char *src, size_t len)
{
    const char *src_end = src + len;

    for (; src != src_end; ++src) {
        if (' ' <= *src && *src < 0x7e) {
            if (*src == '"' || *src == '\\')
                *pos++ = '\\';
            *pos++ = *src;
        } else {
            *pos++ = '\\';
            *pos++ = 'u';
            *pos++ = '0';
            *pos++ = '0';
            *pos++ = ("0123456789abcdef")[(*src >> 4) & 0xf];
            *pos++ = ("0123456789abcdef")[*src & 0xf];
        }
    }

    return pos;
}